

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O2

rfc5444_result
cb_tlv_address(rfc5444_reader_tlvblock_entry *tlv,rfc5444_reader_tlvblock_context *ctx)

{
  uint8_t uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  lVar3 = (long)ctx->consumer->order;
  lVar5 = lVar3 * 0x10;
  uVar1 = (ctx->addr)._addr[3];
  uVar4 = (ulong)tlv->type;
  printf("%s: message tlv %d (order %d): %d\n","cb_tlv_address",uVar4,lVar3,
         (ulong)(uint)callback_index);
  lVar3 = (ulong)(byte)(uVar1 - 1) * 8;
  iVar2 = callback_index + 1;
  *(int *)(lVar5 + lVar3 + 0x1155bc + uVar4 * 4) = callback_index;
  callback_index = iVar2;
  return *(rfc5444_result *)(lVar5 + lVar3 + 0x1155dc + uVar4 * 4);
}

Assistant:

static enum rfc5444_result
cb_tlv_address(struct rfc5444_reader_tlvblock_entry *tlv,
    struct rfc5444_reader_tlvblock_context *ctx) {
  int oi = ctx->consumer->order - 1;
  const uint8_t *addr = netaddr_get_binptr(&ctx->addr);
  const uint8_t ai = addr[3] - 1;
  int ti = tlv->type - 1;

#ifdef PRINT_CB
  printf("%s: message tlv %d (order %d): %d\n",
      __func__, tlv->type, ctx->consumer->order, callback_index);
#endif
  idxcb_tlv_address[oi][ai][ti] = callback_index++;
  return result_tlv_address[oi][ai][ti];
}